

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  *psVar5;
  byte *pbVar6;
  size_t in_R8;
  basic_string_view<char> id;
  byte *local_40;
  format_arg local_38;
  
  local_40 = (byte *)begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  if ((bVar1 != 0x7d) && (bVar1 != 0x3a)) {
    if ((byte)(bVar1 - 0x30) < 10) {
      if (bVar1 == 0x30) {
        local_40 = (byte *)(begin + 1);
        iVar2 = 0;
      }
      else {
        iVar2 = parse_nonnegative_int<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>&>
                          ((char **)&local_40,end,handler);
      }
      if ((local_40 != (byte *)end) && ((*local_40 == 0x3a || (*local_40 == 0x7d)))) {
        psVar5 = handler->handler;
        specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::get_arg(&local_38,
                  &psVar5->
                   super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  ,iVar2);
        goto LAB_0012c72d;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar4 = (byte *)(begin + 1);
      do {
        pbVar3 = pbVar4;
        pbVar6 = (byte *)end;
        if (pbVar3 == (byte *)end) break;
        bVar1 = *pbVar3;
        pbVar4 = pbVar3 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar6 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      id.data_ = pbVar6 + -(long)begin;
      if (-1 < (long)id.data_) {
        psVar5 = handler->handler;
        id.size_ = in_R8;
        get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
                  (&local_38,
                   (detail *)
                   (psVar5->
                   super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   ).context_,
                   (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)begin,id);
        iVar2 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                          ();
        ((psVar5->
         super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         ).super_specs_setter<char>.specs_)->width = iVar2;
        return (char *)pbVar6;
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    error_handler::on_error((error_handler *)&local_38,"invalid format string");
  }
  psVar5 = handler->handler;
  specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  ::get_arg(&local_38,
            &psVar5->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           );
LAB_0012c72d:
  iVar2 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                    ();
  ((psVar5->
   super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
   ).super_specs_setter<char>.specs_)->width = iVar2;
  return (char *)local_40;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}